

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O2

QColor __thiscall QAccessibleWidget::foregroundColor(QAccessibleWidget *this)

{
  ColorRole cr;
  QWidget *pQVar1;
  QPalette *this_00;
  QColor *pQVar2;
  
  pQVar1 = widget(this);
  this_00 = QWidget::palette(pQVar1);
  pQVar1 = widget(this);
  cr = QWidget::foregroundRole(pQVar1);
  pQVar2 = QPalette::color(this_00,cr);
  return *pQVar2;
}

Assistant:

QColor QAccessibleWidget::foregroundColor() const
{
    return widget()->palette().color(widget()->foregroundRole());
}